

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

char * c_escape(char *str,size_t len)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  
  sVar2 = strlen(str);
  if ((sVar2 >> 0x3e != 0) ||
     (pbVar3 = (byte *)malloc(sVar2 * 4 + 1), pbVar5 = pbVar3, pbVar3 == (byte *)0x0)) {
    return (char *)0x0;
  }
  do {
    bVar1 = *str;
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
        pbVar5[2] = 0;
        pbVar5[0] = 0x5c;
        pbVar5[1] = 0x74;
        goto LAB_0011a723;
      }
      if (bVar1 == 10) {
        pbVar5[2] = 0;
        pbVar5[0] = 0x5c;
        pbVar5[1] = 0x6e;
        goto LAB_0011a723;
      }
      if (bVar1 == 0) {
        *pbVar5 = 0;
        return (char *)pbVar3;
      }
LAB_0011a731:
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x40) == 0) {
        curl_msnprintf(pbVar5,5,"\\%03o",bVar1);
        pbVar5 = pbVar5 + 4;
      }
      else {
        *pbVar5 = bVar1;
        pbVar5 = pbVar5 + 1;
      }
    }
    else {
      if (bVar1 == 0xd) {
        pbVar5[2] = 0;
        pbVar5[0] = 0x5c;
        pbVar5[1] = 0x72;
      }
      else if (bVar1 == 0x22) {
        pbVar5[2] = 0;
        pbVar5[0] = 0x5c;
        pbVar5[1] = 0x22;
      }
      else {
        if (bVar1 != 0x5c) goto LAB_0011a731;
        pbVar5[2] = 0;
        pbVar5[0] = 0x5c;
        pbVar5[1] = 0x5c;
      }
LAB_0011a723:
      pbVar5 = pbVar5 + 2;
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

static char *c_escape(const char *str, size_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;

  if(len == CURL_ZERO_TERMINATED)
    len = strlen(str);

  /* Check for possible overflow. */
  if(len > (~(size_t) 0) / 4)
    return NULL;

  /* Allocate space based on worst-case */
  escaped = malloc(4 * len + 1);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; (c = *s) != '\0'; s++) {
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(! isprint(c)) {
      msnprintf(e, 5, "\\%03o", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  *e = '\0';
  return escaped;
}